

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O0

golomb_code_table *
charls::anon_unknown_79::initialize_table(golomb_code_table *__return_storage_ptr__,int32_t k)

{
  short sVar1;
  int32_t iVar2;
  golomb_code local_44;
  golomb_code code_1;
  pair<int,_int> pair_code_1;
  int32_t mapped_error_value_1;
  int16_t error_value_1;
  golomb_code local_24;
  golomb_code code;
  pair<int,_int> pair_code;
  int32_t mapped_error_value;
  int16_t error_value;
  int32_t k_local;
  
  golomb_code_table::golomb_code_table(__return_storage_ptr__);
  pair_code.second._2_2_ = 0;
  while( true ) {
    iVar2 = map_error_value((int)pair_code.second._2_2_);
    code = (golomb_code)create_encoded_value(k,iVar2);
    if (8 < (uint)code.value_) break;
    sVar1 = conditional_static_cast<short,_int,_0>(code.value_);
    golomb_code::golomb_code(&local_24,(int)pair_code.second._2_2_,(int)sVar1);
    golomb_code_table::add_entry(__return_storage_ptr__,(uint8_t)code.length_,local_24);
    pair_code.second._2_2_ = pair_code.second._2_2_ + 1;
  }
  pair_code_1.second._2_2_ = -1;
  while( true ) {
    iVar2 = map_error_value((int)pair_code_1.second._2_2_);
    code_1 = (golomb_code)create_encoded_value(k,iVar2);
    if (8 < (uint)code_1.value_) break;
    golomb_code::golomb_code(&local_44,(int)pair_code_1.second._2_2_,(int)(short)code_1.value_);
    golomb_code_table::add_entry(__return_storage_ptr__,(uint8_t)code_1.length_,local_44);
    pair_code_1.second._2_2_ = pair_code_1.second._2_2_ + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

golomb_code_table initialize_table(const int32_t k) noexcept
{
    golomb_code_table table;
    for (int16_t error_value{};; ++error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const golomb_code code(error_value, conditional_static_cast<int16_t>(pair_code.first));
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    for (int16_t error_value{-1};; --error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const auto code{golomb_code(error_value, static_cast<int16_t>(pair_code.first))};
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    return table;
}